

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O3

void microatf_context_pass(microatf_context_t *context)

{
  char *reason;
  int in_EDX;
  int iVar1;
  
  if (microatf_context_static.expect != MICROATF_EXPECT_PASS) {
    iVar1 = 0x10312e;
    if (microatf_context_static.expect == MICROATF_EXPECT_FAIL) {
      reason = "Test case was expecting a failure but got a pass instead";
    }
    else {
      reason = "Test case asked to explicitly pass but was not expecting such condition";
    }
    microatf_context_write_result(context,"failed",in_EDX,reason);
    microatf_context_exit((microatf_context_t *)0x1,iVar1);
  }
  iVar1 = 0x1031dd;
  microatf_context_write_result(context,"passed",in_EDX,(char *)0x0);
  microatf_context_exit((microatf_context_t *)0x0,iVar1);
}

Assistant:

MICROATF_ATTRIBUTE_NORETURN
static void
microatf_context_pass(microatf_context_t *context)
{
	if (context->expect == MICROATF_EXPECT_FAIL) {
		microatf_context_write_result(context, "failed", -1,
		    "Test case was expecting a failure but got a pass "
		    "instead");
		microatf_context_exit(context, EXIT_FAILURE);
	} else if (context->expect == MICROATF_EXPECT_PASS) {
		microatf_context_write_result(microatf_context, "passed", -1,
		    NULL);
		microatf_context_exit(microatf_context, EXIT_SUCCESS);
	} else {
		microatf_context_write_result(context, "failed", -1,
		    "Test case asked to explicitly pass but was not expecting "
		    "such condition");
		microatf_context_exit(context, EXIT_FAILURE);
	}
}